

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::generate_enum(t_json_generator *this,t_enum *tenum)

{
  t_enum_value *ptVar1;
  int iVar2;
  undefined4 extraout_var;
  _Base_ptr p_Var3;
  pointer pptVar4;
  allocator local_1e9;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> values;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  start_object(this,true);
  std::__cxx11::string::string((string *)&local_130,"name",(allocator *)&values);
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  std::__cxx11::string::string((string *)&local_150,(string *)CONCAT44(extraout_var,iVar2));
  write_key_and_string(this,&local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  if ((tenum->super_t_type).super_t_doc.has_doc_ == true) {
    std::__cxx11::string::string((string *)&local_170,"doc",(allocator *)&values);
    std::__cxx11::string::string
              ((string *)&local_190,(string *)&(tenum->super_t_type).super_t_doc.doc_);
    write_key_and_string(this,&local_170,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
  }
  if ((tenum->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)&local_1b0,"annotations",(allocator *)&values);
    write_key_and(this,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    start_object(this,true);
    for (p_Var3 = (tenum->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(tenum->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var3 + 1));
      std::__cxx11::string::string((string *)&local_70,(string *)(p_Var3 + 2));
      write_key_and_string(this,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    end_object(this);
  }
  std::__cxx11::string::string((string *)&local_1d0,"members",(allocator *)&values);
  write_key_and(this,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  start_array(this);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector(&values,&tenum->constants_);
  for (pptVar4 = values.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      values.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    write_comma_if_needed(this);
    ptVar1 = *pptVar4;
    start_object(this,true);
    std::__cxx11::string::string((string *)&local_90,"name",&local_1e9);
    std::__cxx11::string::string((string *)&local_b0,(string *)&ptVar1->name_);
    write_key_and_string(this,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_d0,"value",&local_1e9);
    write_key_and_integer(this,&local_d0,ptVar1->value_);
    std::__cxx11::string::~string((string *)&local_d0);
    if ((ptVar1->super_t_doc).has_doc_ == true) {
      std::__cxx11::string::string((string *)&local_110,"doc",&local_1e9);
      std::__cxx11::string::string((string *)&local_f0,(string *)&(ptVar1->super_t_doc).doc_);
      write_key_and_string(this,&local_110,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    end_object(this);
    indicate_comma_needed(this);
  }
  end_array(this);
  end_object(this);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base
            (&values.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>);
  return;
}

Assistant:

void t_json_generator::generate_enum(t_enum* tenum) {
  start_object();

  write_key_and_string("name", tenum->get_name());

  if (tenum->has_doc()) {
    write_key_and_string("doc", tenum->get_doc());
  }

  if (tenum->annotations_.size() > 0) {
      write_key_and("annotations");
      start_object();
      for (auto & annotation : tenum->annotations_) {
        write_key_and_string(annotation.first, annotation.second);
      }
      end_object();
  }

  write_key_and("members");
  start_array();
  vector<t_enum_value*> values = tenum->get_constants();
  vector<t_enum_value*>::iterator val_iter;
  for (val_iter = values.begin(); val_iter != values.end(); ++val_iter) {
    write_comma_if_needed();
    t_enum_value* val = (*val_iter);
    start_object();
    write_key_and_string("name", val->get_name());
    write_key_and_integer("value", val->get_value());
    if (val->has_doc()) {
      write_key_and_string("doc", val->get_doc());
    }
    end_object();
    indicate_comma_needed();
  }
  end_array();

  end_object();
}